

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O1

uint64_t lzma_raw_coder_memusage(lzma_filter_find coder_find,lzma_filter *filters)

{
  lzma_vli *plVar1;
  lzma_ret lVar2;
  lzma_filter_coder *plVar3;
  long lVar4;
  lzma_filter *plVar5;
  uint64_t uVar6;
  bool bVar7;
  size_t tmp;
  size_t local_30;
  
  lVar2 = validate_chain(filters,&local_30);
  uVar6 = 0xffffffffffffffff;
  if (lVar2 == LZMA_OK) {
    plVar5 = filters + 1;
    lVar4 = 0;
    do {
      plVar3 = (*coder_find)(plVar5[-1].id);
      if (plVar3 == (lzma_filter_coder *)0x0) {
        bVar7 = false;
      }
      else if (plVar3->memusage == (_func_uint64_t_void_ptr *)0x0) {
        lVar4 = lVar4 + 0x400;
        bVar7 = true;
      }
      else {
        uVar6 = (*plVar3->memusage)(plVar5[-1].options);
        bVar7 = uVar6 != 0xffffffffffffffff;
        if (!bVar7) {
          uVar6 = 0;
        }
        lVar4 = lVar4 + uVar6;
      }
      if (!bVar7) {
        return 0xffffffffffffffff;
      }
      plVar1 = &plVar5->id;
      plVar5 = plVar5 + 1;
    } while (*plVar1 != 0xffffffffffffffff);
    uVar6 = lVar4 + 0x8000;
  }
  return uVar6;
}

Assistant:

extern uint64_t
lzma_raw_coder_memusage(lzma_filter_find coder_find,
		const lzma_filter *filters)
{
	uint64_t total = 0;
	size_t i = 0;

	// The chain has to have at least one filter.
	{
		size_t tmp;
		if (validate_chain(filters, &tmp) != LZMA_OK)
			return UINT64_MAX;
	}

	do {
		const lzma_filter_coder *const fc
				 = coder_find(filters[i].id);
		if (fc == NULL)
			return UINT64_MAX; // Unsupported Filter ID

		if (fc->memusage == NULL) {
			// This filter doesn't have a function to calculate
			// the memory usage and validate the options. Such
			// filters need only little memory, so we use 1 KiB
			// as a good estimate. They also accept all possible
			// options, so there's no need to worry about lack
			// of validation.
			total += 1024;
		} else {
			// Call the filter-specific memory usage calculation
			// function.
			const uint64_t usage
					= fc->memusage(filters[i].options);
			if (usage == UINT64_MAX)
				return UINT64_MAX; // Invalid options

			total += usage;
		}
	} while (filters[++i].id != LZMA_VLI_UNKNOWN);

	// Add some fixed amount of extra. It's to compensate memory usage
	// of Stream, Block etc. coders, malloc() overhead, stack etc.
	return total + LZMA_MEMUSAGE_BASE;
}